

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O0

void AudioBackend_SetSoundVolume(AudioBackend_Sound *sound,long volume)

{
  long volume_local;
  AudioBackend_Sound *sound_local;
  
  if (sound != (AudioBackend_Sound *)0x0) {
    ma_mutex_lock(&mutex);
    SetSoundVolume(sound,volume);
    ma_mutex_unlock(&mutex);
  }
  return;
}

Assistant:

void AudioBackend_SetSoundVolume(AudioBackend_Sound *sound, long volume)
{
	if (sound == NULL)
		return;

	ma_mutex_lock(&mutex);

	SetSoundVolume(sound, volume);

	ma_mutex_unlock(&mutex);
}